

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall
font2svg::glyph::svgtransform_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  FT_Pos FVar1;
  FT_Pos FVar2;
  ostream *poVar3;
  allocator<char> local_49;
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_49);
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  std::__cxx11::string::~string(local_48);
  std::operator<<((ostream *)&this->field_0x270,
                  "\n\n <!-- make sure glyph is visible within svg window -->");
  FVar1 = (this->gm).horiBearingY;
  FVar2 = (this->gm).vertBearingY;
  poVar3 = std::operator<<((ostream *)&this->field_0x270,"\n <g fill-rule=\'nonzero\' ");
  poVar3 = std::operator<<(poVar3," transform=\'translate(");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,100);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)FVar2 + (int)FVar1 + 100);
  poVar3 = std::operator<<(poVar3,")\'");
  std::operator<<(poVar3,">");
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgtransform() {
		// TrueType points are not in the range usually visible by SVG.
		// they often have negative numbers etc. So.. here we
		// 'transform' to make visible.
		//
		// note also that y coords of all points have been flipped during
		// init() so that SVG Y positive = Truetype Y positive
		tmp.str("");
		tmp << "\n\n <!-- make sure glyph is visible within svg window -->";
		int yadj = gm.horiBearingY + gm.vertBearingY + 100;
		int xadj = 100;
		tmp << "\n <g fill-rule='nonzero' "
			<< " transform='translate(" << xadj << " " << yadj << ")'"
			<< ">";
		return tmp.str();
	}